

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::Country::Country(Country *this,Country *toCopy)

{
  string *psVar1;
  pointer pcVar2;
  pointer ppCVar3;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  Country *in_RAX;
  int *piVar4;
  string *psVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  Country *this_02;
  pointer ppCVar6;
  Country *local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"In country copy constructor:",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(toCopy->cyName->_M_dataplus)._M_p,
             toCopy->cyName->_M_string_length);
  piVar4 = (int *)operator_new(4);
  *piVar4 = *toCopy->cyID;
  this->cyID = piVar4;
  psVar5 = (string *)operator_new(0x20);
  psVar1 = toCopy->cyName;
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar5,pcVar2,pcVar2 + psVar1->_M_string_length);
  this->cyName = psVar5;
  piVar4 = (int *)operator_new(4);
  *piVar4 = *toCopy->cyContinent;
  this->cyContinent = piVar4;
  piVar4 = (int *)operator_new(4);
  *piVar4 = *toCopy->pPlayerOwnerId;
  this->pPlayerOwnerId = piVar4;
  piVar4 = (int *)operator_new(4);
  *piVar4 = *toCopy->pNumberOfTroops;
  this->pNumberOfTroops = piVar4;
  this_01 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this_01->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pAdjCountries = this_01;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve
            (this_01,(long)(toCopy->pAdjCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(toCopy->pAdjCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar3 = (toCopy->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar6 = (toCopy->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppCVar6 != ppCVar3; ppCVar6 = ppCVar6 + 1) {
    this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)this->pAdjCountries;
    this_02 = (Country *)operator_new(0x30);
    Country(this_02,*ppCVar6);
    local_38 = this_02;
    std::vector<Map::Country*,std::allocator<Map::Country*>>::emplace_back<Map::Country*>
              (this_00,&local_38);
  }
  return;
}

Assistant:

Map::Country::Country(const Country& toCopy) {
    std::cout << "In country copy constructor:" << *toCopy.cyName;
    this->cyID = new int(*toCopy.cyID);
    this->cyName = new std::string(*toCopy.cyName);
    this->cyContinent = new int(*toCopy.cyContinent);
    this->pPlayerOwnerId = new int(*toCopy.pPlayerOwnerId);
    this->pNumberOfTroops = new int(*toCopy.pNumberOfTroops);
    this->pAdjCountries = new std::vector<Country*>();
    this->pAdjCountries->reserve(toCopy.pAdjCountries->size());
    for(auto & pAdjCountry : *toCopy.pAdjCountries) {
        this->pAdjCountries->push_back(new Country(*pAdjCountry));
    }
}